

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

char * Wlc_PrsConvertInitValues(Wlc_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint *__ptr;
  void *pvVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  uint uVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *paVar10;
  ulong uVar11;
  Wlc_Obj_t *pWVar12;
  int iVar13;
  long lVar14;
  byte bVar15;
  char *pArray;
  long lVar16;
  size_t __size;
  int *piVar17;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar6 = malloc(1000);
  *(void **)(__ptr + 2) = pvVar6;
  pVVar7 = p->vInits;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      iVar13 = pVVar7->pArray[lVar14];
      if ((long)iVar13 < 0) {
        iVar13 = -iVar13;
        lVar16 = (long)(int)__ptr[1];
        uVar8 = *__ptr;
        pvVar6 = *(void **)(__ptr + 2);
        if (iVar13 < 2) {
          iVar13 = 1;
        }
        do {
          if ((uint)lVar16 == uVar8) {
            if ((int)uVar8 < 0x10) {
              if (pvVar6 == (void *)0x0) {
                pvVar6 = malloc(0x10);
              }
              else {
                pvVar6 = realloc(pvVar6,0x10);
              }
              uVar8 = 0x10;
            }
            else {
              uVar1 = uVar8 * 2;
              if (SBORROW4(uVar8,uVar1) != 0 < (int)uVar8) {
                uVar8 = uVar1;
                if (pvVar6 == (void *)0x0) {
                  pvVar6 = malloc((ulong)uVar1);
                }
                else {
                  pvVar6 = realloc(pvVar6,(ulong)uVar1);
                }
              }
            }
          }
          *(undefined1 *)((long)pvVar6 + lVar16) = 0x30;
          lVar16 = lVar16 + 1;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
        __ptr[1] = (uint)lVar16;
        *__ptr = uVar8;
        *(void **)(__ptr + 2) = pvVar6;
      }
      else {
        if ((iVar13 == 0) || (p->nObjsAlloc <= iVar13)) {
LAB_002ffaa3:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                        ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar12 = p->pObjs + iVar13;
        uVar8 = pWVar12->End;
        uVar1 = pWVar12->Beg;
        iVar13 = (uVar8 - uVar1) + 1;
        while ((*(ushort *)pWVar12 & 0x3f) == 7) {
          paVar10 = &pWVar12->field_8;
          if (2 < pWVar12->nFanins) {
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)paVar10->pFanins[0];
          }
          iVar5 = paVar10->Fanins[0];
          if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_002ffaa3;
          pWVar12 = p->pObjs + iVar5;
        }
        if ((*(ushort *)pWVar12 & 0x3f) == 6) {
          piVar17 = (pWVar12->field_8).pFanins[0];
        }
        else {
          piVar17 = (int *)0x0;
        }
        iVar5 = (pWVar12->End - pWVar12->Beg) + 1;
        if (iVar13 < iVar5) {
          iVar5 = iVar13;
        }
        if (iVar5 < 1) {
          uVar11 = 0;
        }
        else {
          uVar9 = *__ptr;
          uVar2 = __ptr[1];
          pvVar6 = *(void **)(__ptr + 2);
          uVar11 = 0;
          do {
            if (piVar17 == (int *)0x0) {
              bVar15 = 0x58;
            }
            else {
              bVar15 = ((uint)piVar17[uVar11 >> 5 & 0x7ffffff] >> ((uint)uVar11 & 0x1f) & 1) != 0 |
                       0x30;
            }
            if (uVar2 + (uint)uVar11 == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (pvVar6 == (void *)0x0) {
                  pvVar6 = malloc(0x10);
                }
                else {
                  pvVar6 = realloc(pvVar6,0x10);
                }
                uVar9 = 0x10;
              }
              else {
                uVar4 = uVar9 * 2;
                if (SBORROW4(uVar9,uVar4) != 0 < (int)uVar9) {
                  uVar9 = uVar4;
                  if (pvVar6 == (void *)0x0) {
                    pvVar6 = malloc((ulong)uVar4);
                  }
                  else {
                    pvVar6 = realloc(pvVar6,(ulong)uVar4);
                  }
                }
              }
            }
            *(byte *)((long)pvVar6 + uVar11 + (long)(int)uVar2) = bVar15;
            iVar5 = (pWVar12->End - pWVar12->Beg) + 1;
            if (iVar13 < iVar5) {
              iVar5 = iVar13;
            }
            uVar11 = uVar11 + 1;
          } while ((int)uVar11 < iVar5);
          __ptr[1] = uVar2 + (int)uVar11;
          *__ptr = uVar9;
          *(void **)(__ptr + 2) = pvVar6;
        }
        if ((int)uVar11 < iVar13) {
          lVar16 = (long)(int)__ptr[1];
          uVar9 = *__ptr;
          pvVar6 = *(void **)(__ptr + 2);
          iVar5 = ~uVar8 + (int)uVar11 + uVar1;
          do {
            if ((uint)lVar16 == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (pvVar6 == (void *)0x0) {
                  pvVar6 = malloc(0x10);
                }
                else {
                  pvVar6 = realloc(pvVar6,0x10);
                }
                uVar9 = 0x10;
              }
              else {
                uVar8 = uVar9 * 2;
                if (SBORROW4(uVar9,uVar8) != 0 < (int)uVar9) {
                  uVar9 = uVar8;
                  if (pvVar6 == (void *)0x0) {
                    pvVar6 = malloc((ulong)uVar8);
                  }
                  else {
                    pvVar6 = realloc(pvVar6,(ulong)uVar8);
                  }
                }
              }
            }
            *(undefined1 *)((long)pvVar6 + lVar16) = 0x30;
            lVar16 = lVar16 + 1;
            iVar5 = iVar5 + 1;
          } while (iVar5 != 0);
          __ptr[1] = (uint)lVar16;
          *__ptr = uVar9;
          *(void **)(__ptr + 2) = pvVar6;
        }
        if (piVar17 == (int *)0x0) {
          if ((undefined1  [24])((undefined1  [24])*pWVar12 & (undefined1  [24])0x3d) !=
              (undefined1  [24])0x1) {
            __assert_fail("Wlc_ObjIsCi(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                          ,0xaa,"int Wlc_ObjCiId(Wlc_Obj_t *)");
          }
          iVar13 = (pWVar12->field_8).Fanins[1];
        }
        else {
          iVar13 = -iVar13;
        }
        if (p->vInits->nSize <= lVar14) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vInits->pArray[lVar14] = iVar13;
      }
      lVar14 = lVar14 + 1;
      pVVar7 = p->vInits;
    } while (lVar14 < pVVar7->nSize);
  }
  uVar8 = __ptr[1];
  uVar1 = *__ptr;
  if (uVar8 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar6 = malloc(0x10);
      }
      else {
        pvVar6 = realloc(*(void **)(__ptr + 2),0x10);
      }
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if ((int)__size <= (int)uVar1) goto LAB_002ffa52;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar6 = malloc(__size);
      }
      else {
        pvVar6 = realloc(*(void **)(__ptr + 2),__size);
      }
    }
    *(void **)(__ptr + 2) = pvVar6;
    *__ptr = (uint)__size;
  }
LAB_002ffa52:
  pcVar3 = *(char **)(__ptr + 2);
  __ptr[1] = uVar8 + 1;
  pcVar3[(int)uVar8] = '\0';
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return pcVar3;
}

Assistant:

char * Wlc_PrsConvertInitValues( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, Value, * pInits;
    char * pResult;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_IntForEachEntry( p->vInits, Value, i )
    {
        if ( Value < 0 )
        {
            for ( k = 0; k < -Value; k++ )
                Vec_StrPush( vStr, '0' );
            continue;
        }
        pObj = Wlc_NtkObj( p, Value );
        Value = Wlc_ObjRange(pObj);
        while ( pObj->Type == WLC_OBJ_BUF )
            pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
        pInits = pObj->Type == WLC_OBJ_CONST ? Wlc_ObjConstValue(pObj) : NULL;
        for ( k = 0; k < Abc_MinInt(Value, Wlc_ObjRange(pObj)); k++ )
            Vec_StrPush( vStr, (char)(pInits ? '0' + Abc_InfoHasBit((unsigned *)pInits, k) : 'X') );
        // extend values with zero, in case the init value signal has different range compared to constant used
        for ( ; k < Value; k++ )
            Vec_StrPush( vStr, '0' );
        // update vInits to contain either number of values or PI index
        Vec_IntWriteEntry( p->vInits, i, pInits ? -Value : Wlc_ObjCiId(pObj) );
    }
    Vec_StrPush( vStr, '\0' );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}